

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  undefined1 local_f8 [8];
  CField field;
  
  CField::CField((CField *)local_f8);
  CField::read((CField *)local_f8,in_ESI,__buf,in_RCX);
  CField::solve((CField *)local_f8);
  while ((size_t *)field.teleport._M_t._M_impl.super__Rb_tree_header._M_node_count !=
         &field.teleport._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    puVar1 = *(undefined8 **)field.teleport._M_t._M_impl.super__Rb_tree_header._M_node_count;
    operator_delete((void *)field.teleport._M_t._M_impl.super__Rb_tree_header._M_node_count,0x18);
    field.teleport._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar1;
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               *)&field.inv_prio.
                  super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>._M_impl.
                  _M_node._M_size);
  while ((size_t *)
         field.prio.super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>._M_impl.
         _M_node._M_size !=
         &field.prio.super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>._M_impl
          ._M_node._M_size) {
    puVar1 = *(undefined8 **)
              field.prio.super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>.
              _M_impl._M_node._M_size;
    operator_delete((void *)field.prio.
                            super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>.
                            _M_impl._M_node._M_size,0x18);
    field.prio.super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>._M_impl.
    _M_node._M_size = (size_t)puVar1;
  }
  while ((size_t *)field.passed._M_t._M_impl.super__Rb_tree_header._M_node_count !=
         &field.passed._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    puVar1 = *(undefined8 **)field.passed._M_t._M_impl.super__Rb_tree_header._M_node_count;
    operator_delete((void *)field.passed._M_t._M_impl.super__Rb_tree_header._M_node_count,0x18);
    field.passed._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar1;
  }
  std::
  _Rb_tree<std::pair<std::pair<int,_int>,_CField::SState>,_std::pair<std::pair<int,_int>,_CField::SState>,_std::_Identity<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<std::pair<int,_int>,_CField::SState>,_std::pair<std::pair<int,_int>,_CField::SState>,_std::_Identity<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
               *)&field._exit);
  std::
  vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
  ::~vector((vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
             *)&field._height);
  return 0;
}

Assistant:

int main()
{
    CField field;

    field.read();
    field.solve();

    return 0;
}